

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

void __thiscall Assimp::ColladaLoader::~ColladaLoader(ColladaLoader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppaVar2;
  pointer ppaVar3;
  pointer ppaVar4;
  pointer ppaVar5;
  pointer ppVar6;
  pointer ppaVar7;
  pointer pcVar8;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_007fec80;
  ppaVar2 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (ppaVar2 != (pointer)0x0) {
    operator_delete(ppaVar2,(long)(this->mAnims).
                                  super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppaVar2)
    ;
  }
  ppaVar3 = (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar3 != (pointer)0x0) {
    operator_delete(ppaVar3,(long)(this->mTextures).
                                  super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppaVar3)
    ;
  }
  ppaVar4 = (this->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar4 != (pointer)0x0) {
    operator_delete(ppaVar4,(long)(this->mLights).
                                  super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppaVar4);
  }
  ppaVar5 = (this->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar5 != (pointer)0x0) {
    operator_delete(ppaVar5,(long)(this->mCameras).
                                  super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppaVar5)
    ;
  }
  ppVar6 = (this->newMats).
           super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar6 != (pointer)0x0) {
    operator_delete(ppVar6,(long)(this->newMats).
                                 super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar6);
  }
  ppaVar7 = (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar7 != (pointer)0x0) {
    operator_delete(ppaVar7,(long)(this->mTargetMeshes).
                                  super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppaVar7);
  }
  ppaVar7 = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar7 != (pointer)0x0) {
    operator_delete(ppaVar7,(long)(this->mMeshes).
                                  super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppaVar7);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mMaterialIndexByName)._M_t);
  std::
  _Rb_tree<Assimp::ColladaMeshIndex,_std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>,_std::_Select1st<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mMeshIndexByID)._M_t);
  pcVar8 = (this->mFileName)._M_dataplus._M_p;
  paVar1 = &(this->mFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar8 != paVar1) {
    operator_delete(pcVar8,paVar1->_M_allocated_capacity + 1);
  }
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

ColladaLoader::~ColladaLoader() {
    // empty
}